

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O0

future<dap::ResponseOrError<dap::LaunchResponse>_> __thiscall
dap::Session::send<dap::LaunchRequest,void>(Session *this,LaunchRequest *request)

{
  byte bVar1;
  TypeInfo *pTVar2;
  TypeInfo *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  future<dap::ResponseOrError<dap::LaunchResponse>_> fVar4;
  Error local_c0;
  ResponseOrError<dap::LaunchResponse> local_a0;
  anon_class_16_1_70ebebfb local_78;
  function<void_(const_void_*,_const_dap::Error_*)> local_68;
  byte local_31;
  undefined1 local_30 [7];
  bool sent;
  promise<dap::ResponseOrError<dap::LaunchResponse>_> promise;
  LaunchRequest *request_local;
  Session *this_local;
  
  promise.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = in_RDX;
  promise<dap::ResponseOrError<dap::LaunchResponse>_>::promise
            ((promise<dap::ResponseOrError<dap::LaunchResponse>_> *)local_30);
  pTVar2 = TypeOf<dap::LaunchRequest>::type();
  pTVar3 = TypeOf<dap::LaunchResponse>::type();
  promise<dap::ResponseOrError<dap::LaunchResponse>_>::promise
            (&local_78.promise,(promise<dap::ResponseOrError<dap::LaunchResponse>_> *)local_30);
  std::function<void(void_const*,dap::Error_const*)>::
  function<dap::Session::send<dap::LaunchRequest,void>(dap::LaunchRequest_const&)::_lambda(void_const*,dap::Error_const*)_1_,void>
            ((function<void(void_const*,dap::Error_const*)> *)&local_68,&local_78);
  bVar1 = (**(code **)((long)(request->restart).val.value.value + 0x50))
                    (request,pTVar2,pTVar3,
                     promise.state.
                     super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi,&local_68);
  std::function<void_(const_void_*,_const_dap::Error_*)>::~function(&local_68);
  send<dap::LaunchRequest,void>(dap::LaunchRequest_const&)::
  {lambda(void_const*,dap::Error_const*)#1}::~Error
            ((_lambda_void_const__dap__Error_const___1_ *)&local_78);
  local_31 = bVar1 & 1;
  if (local_31 == 0) {
    Error::Error(&local_c0,"Failed to send request");
    ResponseOrError<dap::LaunchResponse>::ResponseOrError(&local_a0,&local_c0);
    promise<dap::ResponseOrError<dap::LaunchResponse>_>::set_value
              ((promise<dap::ResponseOrError<dap::LaunchResponse>_> *)local_30,&local_a0);
    ResponseOrError<dap::LaunchResponse>::~ResponseOrError(&local_a0);
    Error::~Error(&local_c0);
  }
  promise<dap::ResponseOrError<dap::LaunchResponse>_>::get_future
            ((promise<dap::ResponseOrError<dap::LaunchResponse>_> *)this);
  promise<dap::ResponseOrError<dap::LaunchResponse>_>::~promise
            ((promise<dap::ResponseOrError<dap::LaunchResponse>_> *)local_30);
  fVar4.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  fVar4.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (future<dap::ResponseOrError<dap::LaunchResponse>_>)
         fVar4.state.
         super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

future<ResponseOrError<typename T::Response>> Session::send(const T& request) {
  using Response = typename T::Response;
  promise<ResponseOrError<Response>> promise;
  auto sent = send(TypeOf<T>::type(), TypeOf<Response>::type(), &request,
                   [=](const void* result, const Error* error) {
                     if (error != nullptr) {
                       promise.set_value(ResponseOrError<Response>(*error));
                     } else {
                       promise.set_value(ResponseOrError<Response>(
                           *reinterpret_cast<const Response*>(result)));
                     }
                   });
  if (!sent) {
    promise.set_value(Error("Failed to send request"));
  }
  return promise.get_future();
}